

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  long lVar1;
  pointer *ppaVar2;
  pointer *ppuVar3;
  pointer pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar8;
  undefined4 uVar12;
  pointer pfVar13;
  undefined4 uVar17;
  iterator iVar14;
  iterator iVar15;
  iterator iVar16;
  undefined1 auVar18 [16];
  uint uVar19;
  bool bVar20;
  int iVar21;
  pointer pfVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  pointer p_Var26;
  pointer pvVar27;
  pointer pvVar28;
  pointer p_Var29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  size_t i;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  iterator iVar36;
  PrimGroup *pPVar37;
  ulong uVar38;
  pointer p_Var39;
  undefined7 in_register_00000089;
  anon_struct_12_3_a9df7b98 *paVar40;
  size_t k;
  ulong uVar41;
  long lVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  vertex_index_t ind [3];
  real_t vx [3];
  real_t vy [3];
  face_t remainingFace;
  uchar local_11d;
  int local_11c;
  PrimGroup *local_118;
  pointer local_110;
  vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *local_108;
  anon_struct_12_3_a9df7b98 local_fc;
  anon_struct_12_3_a9df7b98 local_f0;
  anon_struct_12_3_a9df7b98 local_e4;
  anon_struct_12_3_a9df7b98 local_d8;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int iStack_b8;
  vector<int,_std::allocator<int>_> *local_a8;
  uint local_9c;
  ulong local_98;
  float local_8c [3];
  vector<unsigned_int,std::allocator<unsigned_int>> *local_80;
  vector<int,std::allocator<int>> *local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  float local_64 [3];
  undefined8 local_58;
  vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> local_50;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *local_38;
  
  uVar25 = CONCAT71(in_register_00000089,triangulate) & 0xffffffff;
  if ((((prim_group->faceGroup).
        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (prim_group->faceGroup).
        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
        super__Vector_impl_data._M_finish) &&
      ((prim_group->lineGroup).
       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (prim_group->lineGroup).
       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     ((prim_group->pointsGroup).
      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (prim_group->pointsGroup).
      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar20 = false;
  }
  else {
    local_11c = material_id;
    local_118 = prim_group;
    std::__cxx11::string::_M_assign((string *)shape);
    pfVar22 = (local_118->faceGroup).
              super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pfVar22 !=
        (local_118->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_108 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->mesh;
      local_70 = &(shape->mesh).num_face_vertices;
      local_78 = (vector<int,std::allocator<int>> *)&(shape->mesh).material_ids;
      local_80 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 &(shape->mesh).smoothing_group_ids;
      uVar35 = 0;
      local_9c = (uint)CONCAT71(in_register_00000089,triangulate);
      pPVar37 = local_118;
      local_38 = tags;
      do {
        pvVar28 = pfVar22[uVar35].vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar33 = (long)pfVar22[uVar35].vertex_indices.
                       super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar28 >> 2;
        uVar34 = lVar33 * -0x5555555555555555;
        if (2 < uVar34) {
          pfVar4 = pfVar22 + uVar35;
          local_110 = pfVar4;
          local_98 = uVar35;
          if ((char)uVar25 == '\0') {
            lVar33 = 4;
            uVar38 = uVar34;
            do {
              pvVar28 = pfVar22[uVar35].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_d8.vertex_index = *(int *)((long)pvVar28 + lVar33 + -4);
              uVar8 = *(undefined8 *)((long)&pvVar28->v_idx + lVar33);
              local_d8.texcoord_index = (int)uVar8;
              local_d8.normal_index = (int)((ulong)uVar8 >> 0x20);
              iVar36._M_current =
                   (shape->mesh).indices.
                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar36._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar36,&local_d8);
                pPVar37 = local_118;
              }
              else {
                (iVar36._M_current)->texcoord_index = local_d8.texcoord_index;
                (iVar36._M_current)->vertex_index = local_d8.vertex_index;
                (iVar36._M_current)->normal_index = local_d8.normal_index;
                ppaVar2 = &(shape->mesh).indices.
                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppaVar2 = *ppaVar2 + 1;
              }
              lVar33 = lVar33 + 0xc;
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
            local_d8.vertex_index = CONCAT31(local_d8.vertex_index._1_3_,(uchar)uVar34);
            iVar14._M_current =
                 (shape->mesh).num_face_vertices.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (shape->mesh).num_face_vertices.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              _M_realloc_insert<unsigned_char>(local_70,iVar14,(uchar *)&local_d8);
              pPVar37 = local_118;
            }
            else {
              *iVar14._M_current = (uchar)uVar34;
              ppuVar3 = &(shape->mesh).num_face_vertices.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar3 = *ppuVar3 + 1;
            }
            uVar35 = local_98;
            iVar15._M_current =
                 (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar15._M_current ==
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_78,iVar15,&local_11c);
              pPVar37 = local_118;
            }
            else {
              *iVar15._M_current = local_11c;
              (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar15._M_current + 1;
            }
            iVar16._M_current =
                 (shape->mesh).smoothing_group_ids.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar16._M_current ==
                (shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_80,iVar16,&local_110->smoothing_group_id)
              ;
              pPVar37 = local_118;
            }
            else {
              *iVar16._M_current = local_110->smoothing_group_id;
              (shape->mesh).smoothing_group_ids.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar16._M_current + 1;
            }
          }
          else {
            pfVar13 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar38 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar13 >> 2;
            lVar33 = lVar33 * 0x5555555555555555;
            uVar25 = 1;
            pvVar27 = pvVar28;
            do {
              lVar42 = (long)pvVar27->v_idx;
              if (lVar42 * 3 + 2U < uVar38) {
                uVar23 = lVar33 + uVar25;
                if (lVar33 + uVar25 != 0) {
                  uVar23 = uVar25;
                }
                lVar24 = (long)pvVar28[uVar23].v_idx;
                if ((lVar24 * 3 + 2U < uVar38) &&
                   (lVar30 = (long)pvVar28[(uVar25 + 1) % uVar34].v_idx, lVar30 * 3 + 2U < uVar38))
                {
                  fVar44 = pfVar13[lVar24 * 3] - pfVar13[lVar42 * 3];
                  fVar46 = (float)*(undefined8 *)(pfVar13 + lVar24 * 3 + 1);
                  fVar43 = pfVar13[lVar30 * 3 + 1] - fVar46;
                  fVar48 = (float)((ulong)*(undefined8 *)(pfVar13 + lVar24 * 3 + 1) >> 0x20);
                  fVar46 = fVar46 - (float)*(undefined8 *)(pfVar13 + lVar42 * 3 + 1);
                  fVar47 = fVar48 - (float)((ulong)*(undefined8 *)(pfVar13 + lVar42 * 3 + 1) >> 0x20
                                           );
                  fVar48 = pfVar13[lVar30 * 3 + 2] - fVar48;
                  fVar49 = pfVar13[lVar30 * 3] - pfVar13[lVar24 * 3];
                  fVar45 = ABS(fVar46 * fVar48 - fVar43 * fVar47);
                  fVar48 = ABS(fVar47 * fVar49 - fVar48 * fVar44);
                  fVar43 = ABS(fVar43 * fVar44 - fVar49 * fVar46);
                  if ((1.1920929e-07 < fVar43) ||
                     ((1.1920929e-07 < fVar45 || (1.1920929e-07 < fVar48)))) {
                    if ((fVar45 <= fVar43) || (fVar45 <= fVar48)) {
                      auVar18._4_4_ = -(uint)(fVar45 < fVar43);
                      auVar18._0_4_ = -(uint)(fVar45 < fVar43);
                      auVar18._8_4_ = -(uint)(fVar48 < fVar43);
                      auVar18._12_4_ = -(uint)(fVar48 < fVar43);
                      iVar21 = movmskpd(pvVar28[uVar23].v_idx * 3,auVar18);
                      lVar24 = (ulong)(iVar21 != 3) + 1;
                      lVar42 = 0;
                      goto LAB_002201ae;
                    }
                    break;
                  }
                }
              }
              lVar42 = lVar33 + uVar25;
              pvVar27 = pvVar27 + 1;
              uVar25 = uVar25 + 1;
            } while (lVar42 != 0);
            lVar24 = 2;
            lVar42 = 1;
LAB_002201ae:
            local_a8 = (vector<int,_std::allocator<int>_> *)((ulong)local_a8 & 0xffffffff00000000);
            uVar25 = 1;
            pvVar27 = pvVar28;
            do {
              uVar23 = 0;
              if (uVar25 != uVar34) {
                uVar23 = uVar25;
              }
              lVar30 = (long)pvVar27->v_idx * 3;
              uVar32 = lVar30 + lVar42;
              if ((uVar32 < uVar38) && (uVar31 = lVar30 + lVar24, uVar31 < uVar38)) {
                lVar30 = (long)pvVar28[uVar23].v_idx * 3;
                uVar23 = lVar30 + lVar42;
                if ((uVar23 < uVar38) && (uVar41 = lVar30 + lVar24, uVar41 < uVar38)) {
                  local_a8 = (vector<int,_std::allocator<int>_> *)
                             CONCAT44(local_a8._4_4_,
                                      local_a8._0_4_ +
                                      (pfVar13[uVar32] * pfVar13[uVar41] -
                                      pfVar13[uVar23] * pfVar13[uVar31]) * 0.5);
                }
              }
              lVar30 = lVar33 + uVar25;
              uVar25 = uVar25 + 1;
              pvVar27 = pvVar27 + 1;
            } while (lVar30 != 0);
            local_58._0_4_ = pfVar4->smoothing_group_id;
            local_58._4_4_ = pfVar4->pad_;
            std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::vector
                      (&local_50,&pfVar22[uVar35].vertex_indices);
            local_c8 = -1;
            iStack_c4 = -1;
            iStack_c0 = -1;
            iStack_bc = -1;
            local_d8.vertex_index = -1;
            local_d8.normal_index = -1;
            local_d8.texcoord_index = -1;
            iStack_cc = -1;
            iStack_b8 = -1;
            lVar33 = (long)local_50.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_50.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar25 = (lVar33 >> 2) * -0x5555555555555555;
            pvVar28 = local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((3 < uVar25) &&
               (lVar30 = (long)(pfVar4->vertex_indices).
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pfVar4->vertex_indices).
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start, lVar30 != 0)) {
              uVar35 = (lVar30 >> 2) * -0x5555555555555555;
              uVar38 = 0;
              pvVar27 = local_50.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar34 = uVar25;
              do {
                uVar23 = uVar25;
                uVar25 = uVar23;
                if (uVar38 < uVar23) {
                  uVar25 = 0;
                }
                uVar38 = uVar38 - uVar25;
                pfVar13 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                uVar25 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pfVar13 >> 2;
                paVar40 = &local_d8;
                lVar33 = 0;
                do {
                  uVar32 = (lVar33 + uVar38) % uVar23;
                  paVar40->texcoord_index = pvVar28[uVar32].vn_idx;
                  uVar12 = pvVar28[uVar32].v_idx;
                  uVar17 = pvVar28[uVar32].vt_idx;
                  paVar40->vertex_index = uVar12;
                  paVar40->normal_index = uVar17;
                  uVar32 = (long)(int)uVar12 * 3 + lVar42;
                  if ((uVar32 < uVar25) &&
                     (uVar31 = (long)(int)uVar12 * 3 + lVar24, uVar31 < uVar25)) {
                    local_8c[lVar33] = pfVar13[uVar32];
                    fVar43 = pfVar13[uVar31];
                  }
                  else {
                    local_8c[lVar33] = 0.0;
                    fVar43 = 0.0;
                  }
                  local_64[lVar33] = fVar43;
                  lVar33 = lVar33 + 1;
                  paVar40 = paVar40 + 1;
                } while (lVar33 != 3);
                uVar35 = uVar35 - 1;
                if (uVar34 != uVar23) {
                  uVar35 = uVar23;
                }
                if (0.0 <= ((local_64[2] - local_64[1]) * (local_8c[1] - local_8c[0]) -
                           (local_8c[2] - local_8c[1]) * (local_64[1] - local_64[0])) *
                           local_a8._0_4_) {
                  if (3 < uVar23) {
                    uVar34 = 3;
                    do {
                      lVar33 = (long)pvVar28[(uVar34 + uVar38) % uVar23].v_idx * 3;
                      uVar32 = lVar33 + lVar42;
                      if ((uVar32 < uVar25) && (uVar31 = lVar33 + lVar24, uVar31 < uVar25)) {
                        fVar43 = pfVar13[uVar31];
                        bVar20 = false;
                        lVar33 = 2;
                        lVar30 = 0;
                        fVar44 = local_64[2];
                        do {
                          fVar45 = local_64[lVar30];
                          if ((fVar43 < fVar45 == fVar44 <= fVar43) &&
                             (pfVar13[uVar32] <
                              ((fVar43 - fVar45) * (local_8c[lVar33] - local_8c[lVar30])) /
                              (fVar44 - fVar45) + local_8c[lVar30])) {
                            bVar20 = !bVar20;
                          }
                          lVar1 = lVar30 + 1;
                          lVar33 = lVar30;
                          lVar30 = lVar1;
                          fVar44 = fVar45;
                        } while (lVar1 != 3);
                        if (bVar20) goto LAB_002203f4;
                      }
                      uVar34 = uVar34 + 1;
                    } while (uVar34 != uVar23);
                  }
                  local_e4.vertex_index = local_d8.vertex_index;
                  local_e4.normal_index = local_d8.texcoord_index;
                  local_e4.texcoord_index = local_d8.normal_index;
                  local_f0.vertex_index = iStack_cc;
                  local_f0.normal_index = iStack_c4;
                  local_f0.texcoord_index = local_c8;
                  local_fc.vertex_index = iStack_c0;
                  local_fc.normal_index = iStack_b8;
                  local_fc.texcoord_index = iStack_bc;
                  iVar36._M_current =
                       (shape->mesh).indices.
                       super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar36._M_current ==
                      (shape->mesh).indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                    _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar36,&local_e4);
                    iVar36._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    (iVar36._M_current)->texcoord_index = local_d8.normal_index;
                    (iVar36._M_current)->vertex_index = local_d8.vertex_index;
                    (iVar36._M_current)->normal_index = local_d8.texcoord_index;
                    iVar36._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar36._M_current;
                  }
                  if (iVar36._M_current ==
                      (shape->mesh).indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                    _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar36,&local_f0);
                    iVar36._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    (iVar36._M_current)->texcoord_index = local_f0.texcoord_index;
                    (iVar36._M_current)->vertex_index = local_f0.vertex_index;
                    (iVar36._M_current)->normal_index = local_f0.normal_index;
                    iVar36._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar36._M_current;
                  }
                  if (iVar36._M_current ==
                      (shape->mesh).indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                    _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar36,&local_fc);
                  }
                  else {
                    (iVar36._M_current)->texcoord_index = local_fc.texcoord_index;
                    (iVar36._M_current)->vertex_index = local_fc.vertex_index;
                    (iVar36._M_current)->normal_index = local_fc.normal_index;
                    ppaVar2 = &(shape->mesh).indices.
                               super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar2 = *ppaVar2 + 1;
                  }
                  local_11d = '\x03';
                  iVar14._M_current =
                       (shape->mesh).num_face_vertices.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar14._M_current ==
                      (shape->mesh).num_face_vertices.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                    _M_realloc_insert<unsigned_char>(local_70,iVar14,&local_11d);
                  }
                  else {
                    *iVar14._M_current = '\x03';
                    ppuVar3 = &(shape->mesh).num_face_vertices.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppuVar3 = *ppuVar3 + 1;
                  }
                  iVar15._M_current =
                       (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar15._M_current ==
                      (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_78,iVar15,&local_11c);
                  }
                  else {
                    *iVar15._M_current = local_11c;
                    (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_finish = iVar15._M_current + 1;
                  }
                  iVar16._M_current =
                       (shape->mesh).smoothing_group_ids.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar16._M_current ==
                      (shape->mesh).smoothing_group_ids.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>
                              (local_80,iVar16,&local_110->smoothing_group_id);
                  }
                  else {
                    *iVar16._M_current = local_110->smoothing_group_id;
                    (shape->mesh).smoothing_group_ids.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
                  }
                  uVar25 = (uVar38 + 1) % uVar23;
                  while (uVar34 = uVar25 + 1, uVar34 < uVar23) {
                    local_50.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar25].vn_idx =
                         local_50.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar34].vn_idx;
                    iVar21 = local_50.
                             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar34].vt_idx;
                    local_50.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar25].v_idx =
                         local_50.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar34].v_idx;
                    local_50.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar25].vt_idx = iVar21;
                    uVar25 = uVar34;
                  }
                  pvVar27 = local_50.
                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1;
                  pvVar28 = local_50.
                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_50.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pvVar27;
                }
                else {
LAB_002203f4:
                  uVar38 = uVar38 + 1;
                }
                lVar33 = (long)pvVar27 - (long)pvVar28;
                uVar25 = (lVar33 >> 2) * -0x5555555555555555;
              } while ((3 < uVar25) && (uVar34 = uVar23, uVar35 != 0));
            }
            uVar35 = local_98;
            uVar19 = local_9c;
            if (lVar33 == 0x24) {
              local_e4.vertex_index = pvVar28->v_idx;
              local_f0.vertex_index = pvVar28[1].v_idx;
              local_fc.vertex_index = pvVar28[2].v_idx;
              uVar5 = pvVar28->vt_idx;
              uVar9 = pvVar28->vn_idx;
              uVar6 = pvVar28[1].vt_idx;
              uVar10 = pvVar28[1].vn_idx;
              uVar7 = pvVar28[2].vt_idx;
              uVar11 = pvVar28[2].vn_idx;
              iVar36._M_current =
                   (shape->mesh).indices.
                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_fc.normal_index = uVar11;
              local_fc.texcoord_index = uVar7;
              local_f0.normal_index = uVar10;
              local_f0.texcoord_index = uVar6;
              local_e4.normal_index = uVar9;
              local_e4.texcoord_index = uVar5;
              if (iVar36._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar36,&local_e4);
                iVar36._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
              }
              else {
                (iVar36._M_current)->texcoord_index = uVar5;
                (iVar36._M_current)->vertex_index = local_e4.vertex_index;
                (iVar36._M_current)->normal_index = uVar9;
                iVar36._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
                (shape->mesh).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar36._M_current;
              }
              if (iVar36._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar36,&local_f0);
                iVar36._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
              }
              else {
                (iVar36._M_current)->texcoord_index = local_f0.texcoord_index;
                (iVar36._M_current)->vertex_index = local_f0.vertex_index;
                (iVar36._M_current)->normal_index = local_f0.normal_index;
                iVar36._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
                (shape->mesh).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar36._M_current;
              }
              if (iVar36._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar36,&local_fc);
              }
              else {
                (iVar36._M_current)->texcoord_index = local_fc.texcoord_index;
                (iVar36._M_current)->vertex_index = local_fc.vertex_index;
                (iVar36._M_current)->normal_index = local_fc.normal_index;
                ppaVar2 = &(shape->mesh).indices.
                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppaVar2 = *ppaVar2 + 1;
              }
              local_11d = '\x03';
              iVar14._M_current =
                   (shape->mesh).num_face_vertices.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar14._M_current ==
                  (shape->mesh).num_face_vertices.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                _M_realloc_insert<unsigned_char>(local_70,iVar14,&local_11d);
              }
              else {
                *iVar14._M_current = '\x03';
                ppuVar3 = &(shape->mesh).num_face_vertices.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppuVar3 = *ppuVar3 + 1;
              }
              iVar15._M_current =
                   (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar15._M_current ==
                  (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_78,iVar15,&local_11c);
              }
              else {
                *iVar15._M_current = local_11c;
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar15._M_current + 1;
              }
              iVar16._M_current =
                   (shape->mesh).smoothing_group_ids.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar16._M_current ==
                  (shape->mesh).smoothing_group_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          (local_80,iVar16,&local_110->smoothing_group_id);
                pvVar28 = local_50.
                          super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                *iVar16._M_current = local_110->smoothing_group_id;
                (shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar16._M_current + 1;
                pvVar28 = local_50.
                          super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
            }
            uVar25 = (ulong)uVar19;
            pPVar37 = local_118;
            if (pvVar28 != (pointer)0x0) {
              operator_delete(pvVar28);
              pPVar37 = local_118;
            }
          }
        }
        uVar35 = uVar35 + 1;
        pfVar22 = (pPVar37->faceGroup).
                  super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar35 < (ulong)((long)(pPVar37->faceGroup).
                                      super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar22 >>
                               5));
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (&(shape->mesh).tags,local_38);
    }
    p_Var26 = (local_118->lineGroup).
              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar37 = local_118;
    if (p_Var26 !=
        (local_118->lineGroup).
        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_a8 = &(shape->lines).num_line_vertices;
      uVar25 = 0;
      do {
        pvVar28 = p_Var26[uVar25].vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (p_Var26[uVar25].vertex_indices.
            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
            _M_impl.super__Vector_impl_data._M_finish == pvVar28) {
          uVar35 = 0;
        }
        else {
          lVar33 = 4;
          uVar34 = 0;
          do {
            local_d8.vertex_index = *(int *)((long)pvVar28 + lVar33 + -4);
            uVar8 = *(undefined8 *)((long)&pvVar28->v_idx + lVar33);
            local_d8.texcoord_index = (int)uVar8;
            local_d8.normal_index = (int)((ulong)uVar8 >> 0x20);
            iVar36._M_current =
                 (shape->lines).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar36._M_current ==
                (shape->lines).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>
                        ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->lines,
                         iVar36,&local_d8);
              pPVar37 = local_118;
            }
            else {
              (iVar36._M_current)->texcoord_index = local_d8.texcoord_index;
              (iVar36._M_current)->vertex_index = local_d8.vertex_index;
              (iVar36._M_current)->normal_index = local_d8.normal_index;
              ppaVar2 = &(shape->lines).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppaVar2 = *ppaVar2 + 1;
            }
            uVar34 = uVar34 + 1;
            p_Var26 = (pPVar37->lineGroup).
                      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pvVar28 = *(pointer *)
                       &p_Var26[uVar25].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl;
            uVar35 = ((long)*(pointer *)
                             ((long)&p_Var26[uVar25].vertex_indices.
                                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                     ._M_impl + 8) - (long)pvVar28 >> 2) * -0x5555555555555555;
            lVar33 = lVar33 + 0xc;
          } while (uVar34 < uVar35);
        }
        local_d8.vertex_index = (int)uVar35;
        iVar15._M_current =
             (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar15._M_current ==
            (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_a8,iVar15,&local_d8.vertex_index);
          pPVar37 = local_118;
        }
        else {
          *iVar15._M_current = local_d8.vertex_index;
          (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar15._M_current + 1;
        }
        uVar25 = uVar25 + 1;
        p_Var26 = (pPVar37->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar25 < (ulong)(((long)(pPVar37->lineGroup).
                                       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var26 >>
                                3) * -0x5555555555555555));
    }
    p_Var39 = (pPVar37->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var29 = (pPVar37->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    bVar20 = true;
    if (p_Var39 != p_Var29) {
      uVar25 = 0;
      do {
        pvVar28 = p_Var39[uVar25].vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (p_Var39[uVar25].vertex_indices.
            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
            _M_impl.super__Vector_impl_data._M_finish != pvVar28) {
          lVar33 = 4;
          uVar35 = 0;
          do {
            local_d8.vertex_index = *(int *)((long)pvVar28 + lVar33 + -4);
            uVar8 = *(undefined8 *)((long)&pvVar28->v_idx + lVar33);
            local_d8.texcoord_index = (int)uVar8;
            local_d8.normal_index = (int)((ulong)uVar8 >> 0x20);
            iVar36._M_current =
                 (shape->points).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar36._M_current ==
                (shape->points).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>
                        ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->points
                         ,iVar36,&local_d8);
              pPVar37 = local_118;
            }
            else {
              (iVar36._M_current)->texcoord_index = local_d8.texcoord_index;
              (iVar36._M_current)->vertex_index = local_d8.vertex_index;
              (iVar36._M_current)->normal_index = local_d8.normal_index;
              ppaVar2 = &(shape->points).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppaVar2 = *ppaVar2 + 1;
            }
            uVar35 = uVar35 + 1;
            p_Var39 = (pPVar37->pointsGroup).
                      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pvVar28 = p_Var39[uVar25].vertex_indices.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar33 = lVar33 + 0xc;
          } while (uVar35 < (ulong)(((long)p_Var39[uVar25].vertex_indices.
                                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pvVar28 >> 2) * -0x5555555555555555));
          p_Var29 = (pPVar37->pointsGroup).
                    super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 < (ulong)(((long)p_Var29 - (long)p_Var39 >> 3) * -0x5555555555555555));
      bVar20 = true;
    }
  }
  return bVar20;
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}